

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

bool mjs::is_reserved(token_type t,version v)

{
  bool bVar1;
  logic_error *this;
  
  if (v == es5) {
    bVar1 = find_token<7ul>(t,(token_type (*) [7])es5_reserved_tokens);
    return bVar1;
  }
  if (v != es3) {
    if (v == es1) {
      bVar1 = find_token<16ul>(t,(token_type (*) [16])es1_reserved_tokens);
      return bVar1;
    }
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Invalid version");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  bVar1 = find_token<31ul>(t,(token_type (*) [31])es3_reserved_tokens);
  return bVar1;
}

Assistant:

constexpr bool is_reserved(token_type t, version v) {
    return v == version::es1 ? find_token(t, es1_reserved_tokens) :
           v == version::es3 ? find_token(t, es3_reserved_tokens) :
           v == version::es5 ? find_token(t, es5_reserved_tokens) :
           throw std::logic_error{"Invalid version"};
}